

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_pedersen_blind_sum
              (secp256k1_context *ctx,uchar *blind_out,uchar **blinds,size_t n,size_t npositive)

{
  ulong uVar1;
  void *pvVar2;
  char *pcVar3;
  int overflow;
  uchar *local_80;
  secp256k1_scalar local_78;
  secp256k1_scalar local_50;
  
  if (blind_out == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "blind_out != NULL";
  }
  else if (blinds == (uchar **)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "blinds != NULL";
  }
  else {
    if (npositive <= n) {
      local_78.d[2] = 0;
      local_78.d[3] = 0;
      local_78.d[0] = 0;
      local_78.d[1] = 0;
      uVar1 = 0;
      local_80 = blind_out;
      while( true ) {
        if (n == uVar1) {
          secp256k1_scalar_get_b32(local_80,&local_78);
          return 1;
        }
        secp256k1_scalar_set_b32(&local_50,blinds[uVar1],&overflow);
        if (overflow != 0) break;
        if (npositive <= uVar1) {
          secp256k1_scalar_negate(&local_50,&local_50);
        }
        secp256k1_scalar_add(&local_78,&local_78,&local_50);
        uVar1 = uVar1 + 1;
      }
      return 0;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "npositive <= n";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_pedersen_blind_sum(const secp256k1_context* ctx, unsigned char *blind_out, const unsigned char * const *blinds, size_t n, size_t npositive) {
    secp256k1_scalar acc;
    secp256k1_scalar x;
    size_t i;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(blind_out != NULL);
    ARG_CHECK(blinds != NULL);
    ARG_CHECK(npositive <= n);
    (void) ctx;
    secp256k1_scalar_set_int(&acc, 0);
    for (i = 0; i < n; i++) {
        secp256k1_scalar_set_b32(&x, blinds[i], &overflow);
        if (overflow) {
            return 0;
        }
        if (i >= npositive) {
            secp256k1_scalar_negate(&x, &x);
        }
        secp256k1_scalar_add(&acc, &acc, &x);
    }
    secp256k1_scalar_get_b32(blind_out, &acc);
    secp256k1_scalar_clear(&acc);
    secp256k1_scalar_clear(&x);
    return 1;
}